

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

int computeHostNumPhysicalCores(void)

{
  bool bVar1;
  raw_ostream *prVar2;
  reference this;
  pointer this_00;
  size_t sVar3;
  size_t sVar4;
  size_type sVar5;
  bool bVar6;
  error_code eVar7;
  StringRef SVar8;
  pair<int,_int> local_550;
  char *local_548;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_518;
  char *local_510;
  StringRef local_508;
  undefined1 local_4f8 [8];
  StringRef Val;
  char *local_4d8;
  StringRef Name;
  pair<llvm::StringRef,_llvm::StringRef> Data;
  StringRef local_488;
  char *local_478;
  size_t local_470;
  StringRef *Line;
  iterator __end1;
  iterator __begin1;
  SmallVector<llvm::StringRef,_8U> *__range1;
  SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> UniqueItems;
  int CurCoreId;
  int CurPhysicalId;
  StringRef local_2f0;
  undefined1 local_2e0 [8];
  SmallVector<llvm::StringRef,_8U> strs;
  string local_248;
  undefined1 local_228 [8];
  error_code EC;
  undefined1 local_200 [8];
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> Text;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  SmallVectorBase *local_d0;
  SmallVectorBase *local_c8;
  SmallVectorBase *local_c0;
  size_t local_b8;
  char *local_b0;
  char *local_a8;
  int local_9c;
  size_t local_98;
  size_t local_90;
  char *local_88;
  int local_7c;
  char **local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  int local_44;
  char **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  llvm::Twine::Twine((Twine *)&EC._M_cat,"/proc/cpuinfo");
  llvm::MemoryBuffer::getFileAsStream
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)local_200,(Twine *)&EC._M_cat);
  eVar7 = llvm::
          ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
          getError((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                    *)local_200);
  EC._0_8_ = eVar7._M_cat;
  local_228._0_4_ = eVar7._M_value;
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_228);
  if (bVar1) {
    prVar2 = llvm::errs();
    prVar2 = llvm::raw_ostream::operator<<(prVar2,"Can\'t read ");
    prVar2 = llvm::raw_ostream::operator<<(prVar2,"/proc/cpuinfo: ");
    std::error_code::message_abi_cxx11_(&local_248,(error_code *)local_228);
    prVar2 = llvm::raw_ostream::operator<<(prVar2,&local_248);
    llvm::raw_ostream::operator<<(prVar2,"\n");
    std::__cxx11::string::~string((string *)&local_248);
    Text._20_4_ = 0xffffffff;
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xc] = '\x01';
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xd] = '\0';
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = '\0';
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = '\0';
  }
  else {
    llvm::SmallVector<llvm::StringRef,_8U>::SmallVector
              ((SmallVector<llvm::StringRef,_8U> *)local_2e0);
    this = llvm::
           ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
           operator*((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                      *)local_200);
    this_00 = std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>::
              operator->(this);
    local_2f0 = llvm::MemoryBuffer::getBuffer(this_00);
    strlen("\n");
    llvm::StringRef::split
              (&local_2f0,(SmallVectorImpl<llvm::StringRef> *)local_2e0,_CurCoreId,-1,false);
    UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = -1;
    UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = -1;
    llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::SmallSet
              ((SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *)&__range1);
    local_d0 = (SmallVectorBase *)local_2e0;
    __end1 = (iterator)local_2e0;
    local_c8 = local_d0;
    local_c0 = local_d0;
    sVar3 = llvm::SmallVectorBase::size(local_d0);
    for (; __end1 != (iterator)((long)local_2e0 + sVar3 * 0x10); __end1 = __end1 + 1) {
      strlen(" \t\n\v\f\r");
      SVar8 = llvm::StringRef::trim(__end1,local_488);
      local_478 = SVar8.Data;
      __end1->Data = local_478;
      local_470 = SVar8.Length;
      __end1->Length = local_470;
      sVar4 = strlen("physical id");
      bVar1 = false;
      if (sVar4 <= __end1->Length) {
        local_a8 = __end1->Data;
        local_b0 = "physical id";
        local_b8 = sVar4;
        if (sVar4 == 0) {
          local_9c = 0;
        }
        else {
          local_9c = memcmp(local_a8,"physical id",sVar4);
        }
        bVar1 = local_9c == 0;
      }
      bVar6 = false;
      if (!bVar1) {
        Data.second.Length = (long)"Expected a physical id before seeing another core id" + 0x2d;
        sVar4 = strlen("core id");
        bVar6 = false;
        if (sVar4 <= __end1->Length) {
          local_88 = __end1->Data;
          local_90 = Data.second.Length;
          local_98 = sVar4;
          if (sVar4 == 0) {
            local_7c = 0;
          }
          else {
            local_7c = memcmp(local_88,(void *)Data.second.Length,sVar4);
          }
          bVar6 = local_7c == 0;
        }
        bVar6 = (bool)(bVar6 ^ 1);
      }
      if (!bVar6) {
        llvm::StringRef::split((pair<llvm::StringRef,_llvm::StringRef> *)&Name.Length,__end1,':');
        strlen(" \t\n\v\f\r");
        SVar8 = llvm::StringRef::trim((StringRef *)&Name.Length,stack0xfffffffffffffb18);
        strlen(" \t\n\v\f\r");
        _local_4f8 = llvm::StringRef::trim((StringRef *)&Data.first.Length,local_508);
        local_4d8 = SVar8.Data;
        local_518 = local_4d8;
        Name.Data = (char *)SVar8.Length;
        local_510 = Name.Data;
        local_528 = "physical id";
        local_f8 = (char *)strlen("physical id");
        local_e0 = local_518;
        local_d8 = local_510;
        local_f0 = local_528;
        local_100 = local_528;
        local_70 = local_528;
        local_78 = &local_e0;
        bVar1 = false;
        local_e8 = local_f8;
        local_68 = local_f8;
        if (local_510 == local_f8) {
          local_50 = local_518;
          local_58 = local_528;
          local_60 = local_f8;
          if (local_f8 == (char *)0x0) {
            local_44 = 0;
          }
          else {
            local_44 = memcmp(local_518,local_528,(size_t)local_f8);
          }
          bVar1 = local_44 == 0;
        }
        if (bVar1) {
          if (UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != -1) {
            __assert_fail("CurPhysicalId == -1 && \"Expected a core id before seeing another physical id\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Host.cpp"
                          ,0x458,"int computeHostNumPhysicalCores()");
          }
          llvm::StringRef::getAsInteger<int>
                    ((StringRef *)local_4f8,10,
                     (int *)((long)&UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count
                            + 4));
        }
        local_538 = local_4d8;
        local_530 = Name.Data;
        local_548 = "core id";
        local_30 = (char *)strlen("core id");
        local_110 = local_538;
        local_108 = local_530;
        local_38 = local_548;
        local_40 = &local_110;
        bVar1 = false;
        if (local_530 == local_30) {
          local_18 = local_538;
          local_20 = local_548;
          local_28 = local_30;
          if (local_30 == (char *)0x0) {
            local_c = 0;
          }
          else {
            local_c = memcmp(local_538,local_548,(size_t)local_30);
          }
          bVar1 = local_c == 0;
        }
        if (bVar1) {
          if ((int)UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count != -1) {
            __assert_fail("CurCoreId == -1 && \"Expected a physical id before seeing another core id\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Host.cpp"
                          ,0x45d,"int computeHostNumPhysicalCores()");
          }
          llvm::StringRef::getAsInteger<int>
                    ((StringRef *)local_4f8,10,
                     (int *)&UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        if ((UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != -1) &&
           ((int)UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count != -1)) {
          local_550 = std::make_pair<int&,int&>
                                ((int *)((long)&UniqueItems.Set._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count + 4),
                                 (int *)&UniqueItems.Set._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
          llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::insert
                    ((SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *)
                     &__range1,&local_550);
          UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = -1;
          UniqueItems.Set._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = -1;
        }
      }
    }
    sVar5 = llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::size
                      ((SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *)
                       &__range1);
    Text._20_4_ = SUB84(sVar5,0);
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xc] = '\x01';
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xd] = '\0';
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xe] = '\0';
    strs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
    super_AlignedCharArray<8UL,_16UL>.buffer[0xf] = '\0';
    llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::~SmallSet
              ((SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *)&__range1);
    llvm::SmallVector<llvm::StringRef,_8U>::~SmallVector
              ((SmallVector<llvm::StringRef,_8U> *)local_2e0);
  }
  llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
  ~ErrorOr((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
            *)local_200);
  return Text._20_4_;
}

Assistant:

static int computeHostNumPhysicalCores() {
  // Read /proc/cpuinfo as a stream (until EOF reached). It cannot be
  // mmapped because it appears to have 0 size.
  llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer>> Text =
      llvm::MemoryBuffer::getFileAsStream("/proc/cpuinfo");
  if (std::error_code EC = Text.getError()) {
    llvm::errs() << "Can't read "
                 << "/proc/cpuinfo: " << EC.message() << "\n";
    return -1;
  }
  SmallVector<StringRef, 8> strs;
  (*Text)->getBuffer().split(strs, "\n", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
  int CurPhysicalId = -1;
  int CurCoreId = -1;
  SmallSet<std::pair<int, int>, 32> UniqueItems;
  for (auto &Line : strs) {
    Line = Line.trim();
    if (!Line.startswith("physical id") && !Line.startswith("core id"))
      continue;
    std::pair<StringRef, StringRef> Data = Line.split(':');
    auto Name = Data.first.trim();
    auto Val = Data.second.trim();
    if (Name == "physical id") {
      assert(CurPhysicalId == -1 &&
             "Expected a core id before seeing another physical id");
      Val.getAsInteger(10, CurPhysicalId);
    }
    if (Name == "core id") {
      assert(CurCoreId == -1 &&
             "Expected a physical id before seeing another core id");
      Val.getAsInteger(10, CurCoreId);
    }
    if (CurPhysicalId != -1 && CurCoreId != -1) {
      UniqueItems.insert(std::make_pair(CurPhysicalId, CurCoreId));
      CurPhysicalId = -1;
      CurCoreId = -1;
    }
  }
  return UniqueItems.size();
}